

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

string * QPDF::recover_encryption_key_with_password
                   (string *__return_storage_ptr__,string *password,EncryptionData *data,
                   bool *perms_valid)

{
  bool bVar1;
  int iVar2;
  string *__return_storage_ptr___00;
  string intermediate_key;
  string encrypted_file_key;
  string key_salt;
  string user_data;
  string key_password;
  uchar k [16];
  string perms_check;
  
  *perms_valid = false;
  truncate_password_V5(&key_password,password);
  key_salt._M_dataplus._M_p = (pointer)&key_salt.field_2;
  key_salt._M_string_length = 0;
  user_data._M_dataplus._M_p = (pointer)&user_data.field_2;
  user_data._M_string_length = 0;
  key_salt.field_2._M_local_buf[0] = '\0';
  user_data.field_2._M_local_buf[0] = '\0';
  encrypted_file_key._M_dataplus._M_p = (pointer)&encrypted_file_key.field_2;
  encrypted_file_key._M_string_length = 0;
  encrypted_file_key.field_2._M_local_buf[0] = '\0';
  bVar1 = check_owner_password_V5(&key_password,data);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&intermediate_key,(ulong)&data->O);
    std::__cxx11::string::operator=((string *)&key_salt,(string *)&intermediate_key);
    std::__cxx11::string::~string((string *)&intermediate_key);
    std::__cxx11::string::substr((ulong)&intermediate_key,(ulong)&data->U);
    std::__cxx11::string::operator=((string *)&user_data,(string *)&intermediate_key);
    std::__cxx11::string::~string((string *)&intermediate_key);
    std::__cxx11::string::substr((ulong)&intermediate_key,(ulong)&data->OE);
  }
  else {
    bVar1 = check_user_password_V5(&key_password,data);
    if (!bVar1) goto LAB_001c967b;
    std::__cxx11::string::substr((ulong)&intermediate_key,(ulong)&data->U);
    std::__cxx11::string::operator=((string *)&key_salt,(string *)&intermediate_key);
    std::__cxx11::string::~string((string *)&intermediate_key);
    std::__cxx11::string::substr((ulong)&intermediate_key,(ulong)&data->UE);
  }
  std::__cxx11::string::operator=((string *)&encrypted_file_key,(string *)&intermediate_key);
  std::__cxx11::string::~string((string *)&intermediate_key);
LAB_001c967b:
  hash_V5(&intermediate_key,&key_password,&key_salt,&user_data,data);
  process_with_aes(__return_storage_ptr__,&intermediate_key,false,&encrypted_file_key,0,1,
                   (uchar *)0x0,0);
  __return_storage_ptr___00 = &perms_check;
  process_with_aes(__return_storage_ptr___00,__return_storage_ptr__,false,&data->Perms,0xc,1,
                   (uchar *)0x0,0);
  compute_Perms_value_V5_clear(__return_storage_ptr___00,data,k);
  iVar2 = bcmp(perms_check._M_dataplus._M_p,k,0xc);
  *perms_valid = iVar2 == 0;
  std::__cxx11::string::~string((string *)&perms_check);
  std::__cxx11::string::~string((string *)&intermediate_key);
  std::__cxx11::string::~string((string *)&encrypted_file_key);
  std::__cxx11::string::~string((string *)&user_data);
  std::__cxx11::string::~string((string *)&key_salt);
  std::__cxx11::string::~string((string *)&key_password);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::recover_encryption_key_with_password(
    std::string const& password, EncryptionData const& data, bool& perms_valid)
{
    // Algorithm 3.2a from the PDF 1.7 extension level 3

    // This code does not handle Unicode passwords correctly. Empirical evidence suggests that most
    // viewers don't.  We are supposed to process the input string with the SASLprep (RFC 4013)
    // profile of stringprep (RFC 3454) and then convert the result to UTF-8.

    perms_valid = false;
    std::string key_password = truncate_password_V5(password);
    std::string key_salt;
    std::string user_data;
    std::string encrypted_file_key;
    if (check_owner_password_V5(key_password, data)) {
        key_salt = data.getO().substr(40, 8);
        user_data = data.getU().substr(0, 48);
        encrypted_file_key = data.getOE().substr(0, 32);
    } else if (check_user_password_V5(key_password, data)) {
        key_salt = data.getU().substr(40, 8);
        encrypted_file_key = data.getUE().substr(0, 32);
    }
    std::string intermediate_key = hash_V5(key_password, key_salt, user_data, data);
    std::string file_key = process_with_aes(intermediate_key, false, encrypted_file_key);

    // Decrypt Perms and check against expected value
    std::string perms_check = process_with_aes(file_key, false, data.getPerms(), 12);
    unsigned char k[16];
    compute_Perms_value_V5_clear(file_key, data, k);
    perms_valid = (memcmp(perms_check.c_str(), k, 12) == 0);

    return file_key;
}